

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O3

void read_feed_info(feed_info_t *record,int field_count,char **field_names,char **field_values)

{
  char *__s1;
  int iVar1;
  feed_info_t *__dest;
  ulong uVar2;
  
  record->feed_publisher_name[0] = '\0';
  record->feed_publisher_url[0] = '\0';
  record->feed_lang[0] = '\0';
  record->feed_start_date[0] = '\0';
  record->feed_end_date[0] = '\0';
  record->feed_version[0] = '\0';
  record->feed_contact_email[0] = '\0';
  record->feed_contact_url[0] = '\0';
  if (0 < field_count) {
    uVar2 = 0;
    do {
      __s1 = field_names[uVar2];
      iVar1 = strcmp(__s1,"feed_publisher_name");
      __dest = record;
      if (((((iVar1 == 0) ||
            (iVar1 = strcmp(__s1,"feed_publisher_url"),
            __dest = (feed_info_t *)record->feed_publisher_url, iVar1 == 0)) ||
           (iVar1 = strcmp(__s1,"feed_lang"), __dest = (feed_info_t *)record->feed_lang, iVar1 == 0)
           ) || ((iVar1 = strcmp(__s1,"feed_start_date"),
                 __dest = (feed_info_t *)record->feed_start_date, iVar1 == 0 ||
                 (iVar1 = strcmp(__s1,"feed_end_date"),
                 __dest = (feed_info_t *)record->feed_end_date, iVar1 == 0)))) ||
         ((iVar1 = strcmp(__s1,"feed_version"), __dest = (feed_info_t *)record->feed_version,
          iVar1 == 0 ||
          ((iVar1 = strcmp(__s1,"feed_contact_email"),
           __dest = (feed_info_t *)record->feed_contact_email, iVar1 == 0 ||
           (iVar1 = strcmp(__s1,"feed_contact_url"),
           __dest = (feed_info_t *)record->feed_contact_url, iVar1 == 0)))))) {
        strcpy(__dest->feed_publisher_name,field_values[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)field_count != uVar2);
  }
  return;
}

Assistant:

void read_feed_info(feed_info_t *record, int field_count, const char **field_names, const char **field_values) {
    init_feed_info(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "feed_publisher_name") == 0) {
            strcpy(record->feed_publisher_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_publisher_url") == 0) {
            strcpy(record->feed_publisher_url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_lang") == 0) {
            strcpy(record->feed_lang, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_start_date") == 0) {
            strcpy(record->feed_start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_end_date") == 0) {
            strcpy(record->feed_end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_version") == 0) {
            strcpy(record->feed_version, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_contact_email") == 0) {
            strcpy(record->feed_contact_email, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "feed_contact_url") == 0) {
            strcpy(record->feed_contact_url, field_values[i]);
            continue;
        }
    }
}